

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::Instruction::InsertBefore
          (Instruction *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *inst)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  
  pIVar1 = (inst->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
    __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                  ,0xae,
                  "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                 );
  }
  if ((this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ != (Instruction *)0x0)
  {
    pIVar2 = (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar2 != (Instruction *)0x0) {
      (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar2;
      (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
      (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
    }
    (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = this;
    (pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar1;
    (((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
    super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar1;
    pIVar1 = (inst->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    (inst->_M_t).
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
    return pIVar1;
  }
  __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                ,0xaf,
                "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
               );
}

Assistant:

Instruction* Instruction::InsertBefore(std::unique_ptr<Instruction>&& inst) {
  inst.get()->InsertBefore(this);
  return inst.release();
}